

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontTable.cpp
# Opt level: O2

void __thiscall FontTable::writeSettings(FontTable *this,QSettings *settings)

{
  long lVar1;
  undefined1 *puVar2;
  QArrayDataPointer<char16_t> QStack_68;
  QVariant local_50;
  
  QSettings::beginGroup((QString *)settings);
  puVar2 = FontTableTU::FontKeys;
  for (lVar1 = 0; lVar1 != 0x30; lVar1 = lVar1 + 0x10) {
    QFont::toString();
    QVariant::QVariant(&local_50,(QString *)&QStack_68);
    QSettings::setValue((QString *)settings,(QVariant *)puVar2);
    QVariant::~QVariant(&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_68);
    puVar2 = &(((QVariant *)puVar2)->d).field_0x18;
  }
  QSettings::endGroup();
  return;
}

Assistant:

void FontTable::writeSettings(QSettings &settings) const {

    settings.beginGroup(Keys::Fonts);

    for (int i = 0; i < Count; ++i) {
        settings.setValue(TU::FontKeys[i], mFonts[i].toString());
    }

    settings.endGroup();
}